

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_apply(REF_FACELIFT ref_facelift)

{
  REF_GEOM ref_geom_00;
  REF_NODE pRVar1;
  uint uVar2;
  int local_4c;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT geom;
  REF_DBL xyz [3];
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_FACELIFT ref_facelift_local;
  
  ref_geom_00 = ref_facelift->grid->geom;
  pRVar1 = ref_facelift->grid->node;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x1a2,"ref_facelift_apply","requires indirect facelift");
    ref_facelift_local._4_4_ = 1;
  }
  else {
    for (local_4c = 0; local_4c < ref_geom_00->max; local_4c = local_4c + 1) {
      if (ref_geom_00->descr[local_4c * 6] == 2) {
        uVar2 = ref_egads_eval_at(ref_geom_00,2,ref_geom_00->descr[local_4c * 6 + 1],
                                  ref_geom_00->param + (local_4c << 1),
                                  (REF_DBL *)&ref_private_macro_code_rss,(REF_DBL *)0x0);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x1a7,"ref_facelift_apply",(ulong)uVar2,"eval at");
          return uVar2;
        }
        _ref_private_macro_code_rss =
             ref_facelift->displacement[local_4c * 3] + _ref_private_macro_code_rss;
        xyz[0] = ref_facelift->displacement[local_4c * 3 + 1] + xyz[0];
        xyz[1] = ref_facelift->displacement[local_4c * 3 + 2] + xyz[1];
        pRVar1->real[ref_geom_00->descr[local_4c * 6 + 5] * 0xf] = _ref_private_macro_code_rss;
        pRVar1->real[ref_geom_00->descr[local_4c * 6 + 5] * 0xf + 1] = xyz[0];
        pRVar1->real[ref_geom_00->descr[local_4c * 6 + 5] * 0xf + 2] = xyz[1];
      }
    }
    ref_facelift_local._4_4_ = 0;
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_apply(REF_FACELIFT ref_facelift) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_NODE ref_node = ref_grid_node(ref_facelift_grid(ref_facelift));
  REF_DBL xyz[3];
  REF_INT geom;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  each_ref_geom_face(ref_geom, geom) {
    RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, ref_geom_id(ref_geom, geom),
                          &(ref_geom_param(ref_geom, 0, geom)), xyz, NULL),
        "eval at");
    xyz[0] += ref_facelift_displacement(ref_facelift, 0, geom);
    xyz[1] += ref_facelift_displacement(ref_facelift, 1, geom);
    xyz[2] += ref_facelift_displacement(ref_facelift, 2, geom);
    ref_node_xyz(ref_node, 0, ref_geom_node(ref_geom, geom)) = xyz[0];
    ref_node_xyz(ref_node, 1, ref_geom_node(ref_geom, geom)) = xyz[1];
    ref_node_xyz(ref_node, 2, ref_geom_node(ref_geom, geom)) = xyz[2];
  }
  return REF_SUCCESS;
}